

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegionDetector.hpp
# Opt level: O2

uint __thiscall
RegionDetector::
RegionDetectorDetector<RegionDetector::Region,_RegionDetector::RegionAllocator<RegionDetector::Region>_>
::getNeighborIdx(RegionDetectorDetector<RegionDetector::Region,_RegionDetector::RegionAllocator<RegionDetector::Region>_>
                 *this,uint currentPixel,uint width,uint height,uint edge)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  
  uVar1 = Helpers::idxToX(currentPixel,width);
  uVar2 = Helpers::idxToY(currentPixel,width);
  switch(edge) {
  case 0:
    bVar3 = uVar2 == 0;
    uVar2 = uVar2 - 1;
    if (bVar3) {
      uVar2 = 0;
    }
    break;
  case 1:
    uVar1 = uVar1 + (uVar1 < width - 1);
    break;
  case 2:
    uVar2 = uVar2 + (uVar2 < height - 1);
    break;
  case 3:
    bVar3 = uVar1 == 0;
    uVar1 = uVar1 - 1;
    if (bVar3) {
      uVar1 = 0;
    }
  }
  return uVar2 * width + uVar1;
}

Assistant:

unsigned int getNeighborIdx(const unsigned int currentPixel, const unsigned int  width, const unsigned int height, const unsigned int edge) {

			unsigned int x = Helpers::idxToX(currentPixel, width);
			unsigned int y = Helpers::idxToY(currentPixel, width);

			switch (edge) {
			case 0: // N
				if (y > 0) {
					y--;
				}
				break;
			case 1: // E
				if (x < width - 1) {
					x++;
				}
				break;
			case 2: // S
				if (y < height - 1) {
					y++;
				}
				break;
			case 3: // W
				if (x > 0) {
					x--;
				}
				break;
			}

			return Helpers::xyToIdx(x, y, width);
		}